

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O0

int callback_lws_mirror(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  lws_context *plVar4;
  int local_3070;
  int local_306c;
  int n;
  int l;
  uint rands [4];
  uint8_t *local_3050;
  uchar *p;
  uchar buf [12304];
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  local_306c = 0;
  buf._12296_8_ = len;
  if (reason == LWS_CALLBACK_CLIENT_ESTABLISHED) {
    _lws_log(4,"mirror: LWS_CALLBACK_CLIENT_ESTABLISHED\n");
    if (flag_echo == 0) {
      plVar4 = lws_get_context(wsi);
      lws_get_random(plVar4,&n,4);
      mirror_lifetime = (n & 0xffffU) + 0x4000;
      if (longlived != 0) {
        mirror_lifetime = (n & 0xffffU) + 0x7e120;
      }
      _lws_log(4,"opened mirror connection with %d lifetime\n",(ulong)(uint)mirror_lifetime);
      if (flag_no_mirror_traffic == 0) {
        lws_callback_on_writable(wsi);
      }
    }
    else {
      txb = 0;
      rxb = 0;
      tx.cyc[0] = 0xabcde;
      rx.cyc[0] = 0xabcde;
      tx.cyc[1] = 0x23456789;
      rx.cyc[1] = 0x23456789;
      lws_callback_on_writable(wsi);
    }
  }
  else if (reason == LWS_CALLBACK_CLIENT_RECEIVE) {
    if (flag_echo != 0) {
      local_3050 = (uint8_t *)in;
      for (local_3070 = 0; local_3070 < (int)buf._12296_8_; local_3070 = local_3070 + 1) {
        uVar1 = *local_3050;
        uVar2 = lws_poly_rand(&rx);
        if (uVar1 != uVar2) {
          _lws_log(1,"mismatch at rxb %d offset %d\n",(ulong)(rxb + local_3070 / 0x3000),
                   (long)local_3070 % 0x3000 & 0xffffffff);
          force_exit = 1;
          errs = errs + 1;
          return -1;
        }
        local_3050 = local_3050 + 1;
      }
      for (rx_count = (int)buf._12296_8_ + rx_count; 0x2fff < rx_count; rx_count = rx_count - 0x3000
          ) {
        rxb = rxb + 1;
      }
      if ((rx_count == 0) && (rxb == count_blocks)) {
        _lws_log(4,"Everything received: errs %d\n",(ulong)errs);
        force_exit = 1;
        return -1;
      }
    }
  }
  else if (reason == LWS_CALLBACK_CLIENT_WRITEABLE) {
    _lws_log(0x400,"LWS_CALLBACK_CLIENT_WRITEABLE\n");
    if (flag_no_mirror_traffic != 0) {
      return 0;
    }
    if (flag_echo == 0) {
      for (local_3070 = 0; local_3070 < 1; local_3070 = local_3070 + 1) {
        plVar4 = lws_get_context(wsi);
        lws_get_random(plVar4,&n,0x10);
        iVar3 = sprintf((char *)(buf + (long)(local_306c + 0x10) + -8),"c #%06X %u %u %u;",
                        (ulong)(n & 0xffffff),(ulong)(l & 0x1ff),(ulong)(rands[0] & 0xff),
                        (ulong)((rands[1] & 0x1f) + 1));
        local_306c = iVar3 + local_306c;
      }
      iVar3 = lws_write(wsi,buf + 8,(long)local_306c,opts);
      if (iVar3 < 0) {
        return -1;
      }
      if (iVar3 < local_306c) {
        _lws_log(1,"Partial write LWS_CALLBACK_CLIENT_WRITEABLE\n");
        return -1;
      }
      if (justmirror == 0) {
        mirror_lifetime = mirror_lifetime + -1;
      }
      if (mirror_lifetime == 0) {
        _lws_log(4,"closing mirror session\n");
        return -1;
      }
      lws_callback_on_writable(wsi);
      usleep(0x32);
    }
    else {
      for (local_3070 = 0; local_3070 < 0x3000; local_3070 = local_3070 + 1) {
        uVar1 = lws_poly_rand(&tx);
        buf[(long)(local_3070 + 0x10) + -8] = uVar1;
      }
      iVar3 = lws_write(wsi,buf + 8,0x3000,opts);
      if (iVar3 < 0) {
        _lws_log(1,"Error sending\n");
        return -1;
      }
      txb = txb + 1;
      if (txb == count_blocks) {
        _lws_log(4,"send completed: %d x %d\n",(ulong)count_blocks,0x3000);
      }
      else {
        lws_callback_on_writable(wsi);
      }
    }
  }
  else if (reason == LWS_CALLBACK_CLIENT_CLOSED) {
    _lws_log(4,"mirror: LWS_CALLBACK_CLOSED mirror_lifetime=%d, rxb %d, rx_count %d\n",
             (ulong)(uint)mirror_lifetime,(ulong)rxb,(ulong)rx_count);
    wsi_mirror = (lws *)0x0;
    if ((flag_echo != 0) || (once != 0)) {
      force_exit = 1;
    }
  }
  return 0;
}

Assistant:

static int
callback_lws_mirror(struct lws *wsi, enum lws_callback_reasons reason,
		    void *user, void *in, size_t len)
{
	unsigned char buf[LWS_PRE + block_size], *p;
	unsigned int rands[4];
	int l = 0;
	int n;

	switch (reason) {
	case LWS_CALLBACK_CLIENT_ESTABLISHED:

		lwsl_notice("mirror: LWS_CALLBACK_CLIENT_ESTABLISHED\n");

		if (flag_echo) {
			rxb = txb = 0;
			rx.cyc[0] = tx.cyc[0] = 0xabcde;
			rx.cyc[1] = tx.cyc[1] = 0x23456789;

			lws_callback_on_writable(wsi);

			break;
		}

		lws_get_random(lws_get_context(wsi), rands, sizeof(rands[0]));
		mirror_lifetime = 16384 + (rands[0] & 65535);
		/* useful to test single connection stability */
		if (longlived)
			mirror_lifetime += 500000;

		lwsl_notice("opened mirror connection with "
			  "%d lifetime\n", mirror_lifetime);

		/*
		 * mirror_lifetime is decremented each send, when it reaches
		 * zero the connection is closed in the send callback.
		 * When the close callback comes, wsi_mirror is set to NULL
		 * so a new connection will be opened
		 *
		 * start the ball rolling,
		 * LWS_CALLBACK_CLIENT_WRITEABLE will come next service
		 */
		if (!flag_no_mirror_traffic)
			lws_callback_on_writable(wsi);
		break;

	case LWS_CALLBACK_CLIENT_CLOSED:
		lwsl_notice("mirror: LWS_CALLBACK_CLOSED mirror_lifetime=%d, "
			    "rxb %d, rx_count %d\n", mirror_lifetime, rxb,
			    rx_count);
		wsi_mirror = NULL;
		if (flag_echo || once)
			force_exit = 1;
		break;

	case LWS_CALLBACK_CLIENT_WRITEABLE:
		lwsl_user("LWS_CALLBACK_CLIENT_WRITEABLE\n");
		if (flag_no_mirror_traffic)
			return 0;

		if (flag_echo) {
			for (n = 0; n < (int)block_size; n++)
				buf[LWS_PRE + n] = lws_poly_rand(&tx);

			n = lws_write(wsi, &buf[LWS_PRE], block_size,
				      opts | LWS_WRITE_TEXT);
			if (n < 0) {
				lwsl_err("Error sending\n");
				return -1;
			}

			txb++;
			if (txb != count_blocks)
				lws_callback_on_writable(wsi);
			else {
				lwsl_notice("send completed: %d x %d\n",
					    count_blocks, block_size);
			}
			break;
		}

		for (n = 0; n < 1; n++) {
			lws_get_random(lws_get_context(wsi), rands,
				       sizeof(rands));
			l += sprintf((char *)&buf[LWS_PRE + l],
					"c #%06X %u %u %u;",
					rands[0] & 0xffffff,	/* colour */
					rands[1] & 511,		/* x */
					rands[2] & 255,		/* y */
					(rands[3] & 31) + 1);	/* radius */
		}

		n = lws_write(wsi, &buf[LWS_PRE], l,
			      opts | LWS_WRITE_TEXT);
		if (n < 0)
			return -1;
		if (n < l) {
			lwsl_err("Partial write LWS_CALLBACK_CLIENT_WRITEABLE\n");
			return -1;
		}
		if (!justmirror)
			mirror_lifetime--;
		if (!mirror_lifetime) {
			lwsl_notice("closing mirror session\n");
			return -1;
		}
		/* get notified as soon as we can write again */
		lws_callback_on_writable(wsi);

#if !defined(_WIN32) && !defined(WIN32)
		usleep(50);
#endif
		break;

	case LWS_CALLBACK_CLIENT_RECEIVE:
		if (flag_echo) {
			p = (unsigned char *)in;
			for (n = 0; n < (int)len; n++)
				if (*p++ != lws_poly_rand(&rx)) {
					lwsl_err("mismatch at rxb %d offset %d\n", rxb + (n / block_size), n % block_size);
					errs++;
					force_exit = 1;
					return -1;
				}
			rx_count += (unsigned int)(unsigned long long)len;
			while (rx_count >= block_size) {
				rx_count -= block_size;
				rxb++;
			}
			if (rx_count == 0 && rxb == count_blocks) {
				lwsl_notice("Everything received: errs %d\n",
					    errs);
				force_exit = 1;
				return -1;
			}
		}
		break;
	default:
		break;
	}

	return 0;
}